

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::type_caster_holder<Job,_std::shared_ptr<Job>_>::load
          (type_caster_holder<Job,_std::shared_ptr<Job>_> *this,handle src,bool convert,
          PyTypeObject *tobj)

{
  type_info *ptVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  handle hVar4;
  pointer pp_Var5;
  bool bVar6;
  int iVar7;
  internals *piVar8;
  ulong uVar9;
  iterator *self;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  pointer pp_Var12;
  bool bVar13;
  iterator __begin5;
  tuple parents;
  iterator __end5;
  iterator local_78;
  object local_60;
  iterator local_58;
  object *local_38;
  
  ptVar1 = (this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo;
  if (ptVar1 == (type_info *)0x0 || src.m_ptr == (PyObject *)0x0) {
    return false;
  }
  if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    (this->super_type_caster_base<Job>).super_type_caster_generic.value = (void *)0x0;
    return true;
  }
  if (ptVar1->simple_type == true) {
    iVar7 = PyType_IsSubtype(tobj);
    if (iVar7 != 0) {
LAB_001102dc:
      bVar13 = load_value_and_holder(this,src);
      return bVar13;
    }
    goto LAB_0011041f;
  }
  if (ptVar1->type == tobj) goto LAB_001102dc;
  piVar8 = get_internals();
  uVar2 = (piVar8->registered_types_py)._M_h._M_bucket_count;
  uVar9 = (ulong)tobj % uVar2;
  p_Var10 = (piVar8->registered_types_py)._M_h._M_buckets[uVar9];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var10->_M_nxt, p_Var11 = p_Var10, (PyTypeObject *)p_Var10->_M_nxt[1]._M_nxt != tobj
     )) {
    while (p_Var10 = p_Var3, p_Var3 = p_Var10->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar9) ||
         (p_Var11 = p_Var10, (PyTypeObject *)p_Var3[1]._M_nxt == tobj)) goto LAB_001102f8;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_001102f8:
  if (p_Var11 == (__node_base_ptr)0x0) {
    bVar13 = false;
  }
  else {
    bVar13 = p_Var11->_M_nxt != (_Hash_node_base *)0x0;
  }
  if (((-1 < (int)((tobj->ob_base).ob_base.ob_type)->tp_flags) || (bVar13)) ||
     (hVar4.m_ptr = tobj->tp_bases, hVar4.m_ptr == (PyObject *)0x0)) {
LAB_001103f7:
    bVar6 = try_implicit_casts<std::shared_ptr<Job>,_0>(this,src,convert);
  }
  else {
    (hVar4.m_ptr)->ob_refcnt = (hVar4.m_ptr)->ob_refcnt + 1;
    local_60.super_handle.m_ptr = (handle)(handle)hVar4.m_ptr;
    local_78.super_object.super_handle.m_ptr = (handle)PyObject_GetIter();
    local_78.ready = false;
    local_78.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_58.ready = false;
    local_58.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_58.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    while (bVar13 = iterator::operator!=(&local_78,&local_58), bVar13) {
      if ((local_78.ready == false) && (local_78.super_object.super_handle.m_ptr != (PyObject *)0x0)
         ) {
        iterator::advance(&local_78);
        local_78.ready = true;
      }
      bVar6 = load(this,src,convert,(PyTypeObject *)local_78.value.super_handle.m_ptr);
      if (bVar6) {
        bVar6 = true;
        goto LAB_001103c2;
      }
      if (local_78.super_object.super_handle.m_ptr != (PyObject *)0x0) {
        iterator::advance(&local_78);
      }
    }
    bVar6 = false;
LAB_001103c2:
    object::~object(&local_58.value);
    object::~object(&local_58.super_object);
    object::~object(&local_78.value);
    object::~object(&local_78.super_object);
    object::~object(&local_60);
    if (!bVar13) goto LAB_001103f7;
  }
  if (bVar6 != false) {
    return true;
  }
LAB_0011041f:
  if (convert) {
    ptVar1 = (this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo;
    pp_Var12 = (ptVar1->implicit_conversions).
               super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pp_Var5 = *(pointer *)
               ((long)&(ptVar1->implicit_conversions).
                       super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                       ._M_impl.super__Vector_impl_data + 8);
    bVar13 = pp_Var12 == pp_Var5;
    if (!bVar13) {
      local_38 = &(this->super_type_caster_base<Job>).super_type_caster_generic.temp;
      do {
        local_78.super_object.super_handle.m_ptr =
             (handle)(**pp_Var12)(src.m_ptr,
                                  ((this->super_type_caster_base<Job>).super_type_caster_generic.
                                  typeinfo)->type);
        object::operator=(local_38,&local_78.super_object);
        object::~object(&local_78.super_object);
        bVar6 = load(this,(this->super_type_caster_base<Job>).super_type_caster_generic.temp.
                          super_handle.m_ptr,false);
        if (bVar6) {
          if (bVar13) {
            return false;
          }
          return true;
        }
        pp_Var12 = pp_Var12 + 1;
        bVar13 = pp_Var12 == pp_Var5;
      } while (!bVar13);
    }
  }
  return false;
}

Assistant:

bool load(handle src, bool convert, PyTypeObject *tobj) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            value = nullptr;
            return true;
        }

        if (typeinfo->simple_type) { /* Case 1: no multiple inheritance etc. involved */
            /* Check if we can safely perform a reinterpret-style cast */
            if (PyType_IsSubtype(tobj, typeinfo->type))
                return load_value_and_holder(src);
        } else { /* Case 2: multiple inheritance */
            /* Check if we can safely perform a reinterpret-style cast */
            if (tobj == typeinfo->type)
                return load_value_and_holder(src);

            /* If this is a python class, also check the parents recursively */
            auto const &type_dict = get_internals().registered_types_py;
            bool new_style_class = PyType_Check((PyObject *) tobj);
            if (type_dict.find(tobj) == type_dict.end() && new_style_class && tobj->tp_bases) {
                auto parents = reinterpret_borrow<tuple>(tobj->tp_bases);
                for (handle parent : parents) {
                    bool result = load(src, convert, (PyTypeObject *) parent.ptr());
                    if (result)
                        return true;
                }
            }

            if (try_implicit_casts(src, convert))
                return true;
        }

        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load(temp, false))
                    return true;
            }
        }

        return false;
    }